

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_grail_sort_dyn_buffer(int64_t *arr,size_t Len)

{
  int64_t *piVar1;
  ulong in_RSI;
  int64_t *ExtBuf;
  int L;
  int in_stack_0000003c;
  int64_t *in_stack_00000040;
  int in_stack_0000004c;
  int64_t *in_stack_00000050;
  size_t in_stack_00000fd8;
  int64_t *in_stack_00000fe0;
  undefined4 local_14;
  
  for (local_14 = 1; (ulong)(long)(local_14 * local_14) < in_RSI; local_14 = local_14 << 1) {
  }
  piVar1 = sorter_sort_new_buffer(0x10bd0e);
  if (piVar1 == (int64_t *)0x0) {
    sorter_grail_sort_fixed_buffer(in_stack_00000fe0,in_stack_00000fd8);
  }
  else {
    sorter_grail_common_sort
              (in_stack_00000050,in_stack_0000004c,in_stack_00000040,in_stack_0000003c);
    sorter_sort_delete_buffer((int64_t *)0x10bd50);
  }
  return;
}

Assistant:

void GRAIL_SORT_DYN_BUFFER(SORT_TYPE *arr, size_t Len) {
  int L = 1;
  SORT_TYPE *ExtBuf;

  while (L * L < Len) {
    L *= 2;
  }

  ExtBuf = SORT_NEW_BUFFER(L);

  if (ExtBuf == NULL) {
    GRAIL_SORT_FIXED_BUFFER(arr, Len);
  } else {
    GRAIL_COMMON_SORT(arr, (int)Len, ExtBuf, L);
    SORT_DELETE_BUFFER(ExtBuf);
  }
}